

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

void __thiscall wallet::CWallet::BlockUntilSyncedToCurrentChain(CWallet *this)

{
  Chain *pCVar1;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  uint256 last_block_hash;
  unique_lock<std::recursive_mutex> uStack_58;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_58,&this->cs_wallet,
             "cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x62f,false);
  local_48 = *(undefined8 *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
  uStack_40 = *(undefined8 *)
               ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
  local_38 = *(undefined8 *)
              ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
  uStack_30 = *(undefined8 *)
               ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_58);
  pCVar1 = chain(this);
  (*pCVar1->_vptr_Chain[0x2a])(pCVar1,&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CWallet::BlockUntilSyncedToCurrentChain() const {
    AssertLockNotHeld(cs_wallet);
    // Skip the queue-draining stuff if we know we're caught up with
    // chain().Tip(), otherwise put a callback in the validation interface queue and wait
    // for the queue to drain enough to execute it (indicating we are caught up
    // at least with the time we entered this function).
    uint256 last_block_hash = WITH_LOCK(cs_wallet, return m_last_block_processed);
    chain().waitForNotificationsIfTipChanged(last_block_hash);
}